

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_ffrecord.c
# Opt level: O0

TRef recff_string_start(jit_State *J,GCstr *s,int32_t *st,TRef tr,TRef trlen,TRef tr0)

{
  IRRef1 IVar1;
  IROpT IVar3;
  TRef TVar4;
  int local_90;
  int32_t start;
  TRef tr0_local;
  TRef trlen_local;
  TRef tr_local;
  int32_t *st_local;
  GCstr *s_local;
  jit_State *J_local;
  IRRef1 IVar2;
  
  local_90 = *st;
  IVar1 = (IRRef1)tr;
  IVar2 = (IRRef1)tr0;
  if (local_90 < 0) {
    (J->fold).ins.field_0.ot = 0x93;
    (J->fold).ins.field_0.op1 = IVar1;
    (J->fold).ins.field_0.op2 = IVar2;
    lj_opt_fold(J);
    (J->fold).ins.field_0.ot = 0x2913;
    (J->fold).ins.field_0.op1 = (IRRef1)trlen;
    (J->fold).ins.field_0.op2 = IVar1;
    tr0_local = lj_opt_fold(J);
    local_90 = local_90 + s->len;
    IVar3 = 0x193;
    if (local_90 < 0) {
      IVar3 = 0x93;
    }
    (J->fold).ins.field_0.ot = IVar3;
    (J->fold).ins.field_0.op1 = (IRRef1)tr0_local;
    (J->fold).ins.field_0.op2 = IVar2;
    lj_opt_fold(J);
    if (local_90 < 0) {
      local_90 = 0;
      tr0_local = tr0;
    }
  }
  else if (local_90 == 0) {
    (J->fold).ins.field_0.ot = 0x893;
    (J->fold).ins.field_0.op1 = IVar1;
    (J->fold).ins.field_0.op2 = IVar2;
    lj_opt_fold(J);
    local_90 = 0;
    tr0_local = tr0;
  }
  else {
    TVar4 = lj_ir_kint(J,-1);
    (J->fold).ins.field_0.ot = 0x2913;
    (J->fold).ins.field_0.op1 = IVar1;
    (J->fold).ins.field_0.op2 = (IRRef1)TVar4;
    tr0_local = lj_opt_fold(J);
    (J->fold).ins.field_0.ot = 0x193;
    (J->fold).ins.field_0.op1 = (IRRef1)tr0_local;
    (J->fold).ins.field_0.op2 = IVar2;
    lj_opt_fold(J);
    local_90 = local_90 + -1;
  }
  *st = local_90;
  return tr0_local;
}

Assistant:

static TRef recff_string_start(jit_State *J, GCstr *s, int32_t *st, TRef tr,
			       TRef trlen, TRef tr0)
{
  int32_t start = *st;
  if (start < 0) {
    emitir(IRTGI(IR_LT), tr, tr0);
    tr = emitir(IRTI(IR_ADD), trlen, tr);
    start = start + (int32_t)s->len;
    emitir(start < 0 ? IRTGI(IR_LT) : IRTGI(IR_GE), tr, tr0);
    if (start < 0) {
      tr = tr0;
      start = 0;
    }
  } else if (start == 0) {
    emitir(IRTGI(IR_EQ), tr, tr0);
    tr = tr0;
  } else {
    tr = emitir(IRTI(IR_ADD), tr, lj_ir_kint(J, -1));
    emitir(IRTGI(IR_GE), tr, tr0);
    start--;
  }
  *st = start;
  return tr;
}